

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O3

void __thiscall
Js::JSONStringifier::ReadProxy
          (JSONStringifier *this,JavascriptProxy *proxyObject,JSONObject *jsonObject,
          JSONObjectStack *stack)

{
  code *pcVar1;
  JSONStringifier *pJVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  JavascriptArray *pJVar6;
  undefined4 *puVar7;
  undefined4 extraout_var;
  JavascriptString *propertyName;
  Type TVar8;
  uint uVar9;
  ulong uVar10;
  undefined1 local_98 [8];
  PropertyDescriptor propertyDescriptor;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  JSONStringifier *local_40;
  Type local_34;
  
  uVar10 = 0;
  propertyRecord = (PropertyRecord *)proxyObject;
  local_40 = this;
  pJVar6 = JavascriptProxy::PropertyKeysTrap
                     (proxyObject,GetOwnPropertyNamesKind,this->scriptContext);
  TVar8 = (pJVar6->super_ArrayObject).length;
  if (TVar8 != 0) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    propertyDescriptor._40_8_ = puVar7;
    local_34 = TVar8;
    do {
      iVar4 = (*(pJVar6->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(pJVar6,uVar10);
      bVar3 = VarIs<Js::JavascriptString>((Var)CONCAT44(extraout_var,iVar4));
      if ((bVar3) &&
         (propertyName = UnsafeVarTo<Js::JavascriptString>((Var)CONCAT44(extraout_var,iVar4)),
         propertyName != (JavascriptString *)0x0)) {
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_98);
        pJVar2 = local_40;
        JavascriptConversion::ToPropertyKey
                  (propertyName,local_40->scriptContext,&local_50,(PropertyString **)0x0);
        BVar5 = JavascriptOperators::GetOwnPropertyDescriptor
                          ((RecyclableObject *)propertyRecord,local_50->pid,pJVar2->scriptContext,
                           (PropertyDescriptor *)local_98);
        puVar7 = (undefined4 *)propertyDescriptor._40_8_;
        TVar8 = local_34;
        if ((BVar5 != 0) &&
           (bVar3 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_98),
           puVar7 = (undefined4 *)propertyDescriptor._40_8_, TVar8 = local_34, bVar3)) {
          ReadObjectElement(local_40,propertyName,local_50,(RecyclableObject *)propertyRecord,
                            jsonObject,stack);
          puVar7 = (undefined4 *)propertyDescriptor._40_8_;
          TVar8 = local_34;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
                                    ,0x216,"(propertyName)","propertyName");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (TVar8 != uVar9);
  }
  return;
}

Assistant:

void
JSONStringifier::ReadProxy(_In_ JavascriptProxy* proxyObject, _In_ JSONObject* jsonObject, _In_ JSONObjectStack* stack)
{
    JavascriptArray* ownPropertyNames = proxyObject->PropertyKeysTrap(JavascriptProxy::KeysTrapKind::GetOwnPropertyNamesKind, this->scriptContext);

    // filter enumerable keys
    uint32 resultLength = ownPropertyNames->GetLength();
    for (uint32 i = 0; i < resultLength; i++)
    {
        Var element = ownPropertyNames->DirectGetItem(i);

        // Array should only have string elements, but let's check to be safe
        JavascriptString* propertyName = JavascriptOperators::TryFromVar<JavascriptString>(element);
        Assert(propertyName);
        if (propertyName != nullptr)
        {
            PropertyDescriptor propertyDescriptor;
            PropertyRecord const* propertyRecord;
            JavascriptConversion::ToPropertyKey(propertyName, scriptContext, &propertyRecord, nullptr);
            if (JavascriptOperators::GetOwnPropertyDescriptor(proxyObject, propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptor))
            {
                if (propertyDescriptor.IsEnumerable())
                {
                    this->ReadObjectElement(propertyName, propertyRecord, proxyObject, jsonObject, stack);
                }
            }
        }
    }
}